

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosDynamicBinder.cpp
# Opt level: O0

void __thiscall adios2::helper::DynamicBinder::DynamicBinder(DynamicBinder *this,string *libName)

{
  string *in_RSI;
  string *in_stack_000003e0;
  string *in_stack_000003e8;
  DynamicBinder *in_stack_000003f0;
  allocator local_51;
  string local_50 [32];
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  DynamicBinder(in_stack_000003f0,in_stack_000003e8,in_stack_000003e0);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

DynamicBinder::DynamicBinder(std::string libName) : DynamicBinder(libName, "") {}